

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  PropertySpecSyntax *args_6;
  ActionBlockSyntax *args_8;
  ConcurrentAssertionStatementSyntax *pCVar1;
  DeepCloneVisitor visitor_2;
  NamedLabelSyntax *local_78;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  Token local_50;
  Token local_40;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_78 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_78 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),&visitor,(BumpAllocator *)__child_stack);
  }
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  args_6 = (PropertySpecSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x88),&visitor_1,(BumpAllocator *)__child_stack);
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0x90),(BumpAllocator *)__child_stack);
  args_8 = (ActionBlockSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0xa0),&visitor_2,(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConcurrentAssertionStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertySpecSyntax&,slang::parsing::Token,slang::syntax::ActionBlockSyntax&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_78,args_2,
                      (Token *)&visitor,&local_40,&local_50,args_6,(Token *)&visitor_1,args_8);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConcurrentAssertionStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConcurrentAssertionStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.propertyOrSequence.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<PropertySpecSyntax>(*node.propertySpec, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<ActionBlockSyntax>(*node.action, alloc)
    );
}